

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
::_add_new_label(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Sparse>
                 *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *label_i)

{
  iterator iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_label_to_idx)._M_h,label_i);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_idx_to_label,label_i);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->_idx_to_label).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->_idx_to_label).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    _set_label_to_idx(this);
    std::__cxx11::string::string((string *)&bStack_38,(string *)label_i);
    _insert_label_into_mat<cimod::Sparse>(this,&bStack_38,(dispatch_t<cimod::Sparse,_Sparse>)0x0);
    std::__cxx11::string::~string((string *)&bStack_38);
  }
  return;
}

Assistant:

inline void _add_new_label( IndexType label_i ) {
      if ( _label_to_idx.find( label_i ) == _label_to_idx.end() ) {
        // add label_i
        _idx_to_label.push_back( label_i );
        std::sort( _idx_to_label.begin(), _idx_to_label.end() );
        _set_label_to_idx();

        _insert_label_into_mat( label_i );
      }
    }